

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_footer_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  string footer;
  string local_38;
  
  App::get_footer_abi_cxx11_(&local_38,app);
  if (local_38._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(footer.empty()) {
        return std::string{};
    }
    return footer + "\n";
}